

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecode.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_bytecodeInterpreter_getSourcePositionForActivationRecord
          (sysbvm_context_t *context,
          sysbvm_stackFrameBytecodeFunctionActivationRecord_t *activationRecord)

{
  sysbvm_functionDefinition_t **functionDefinitionObject;
  sysbvm_tuple_t actualSourcePosition;
  sysbvm_functionBytecode_t **functionBytecodeObject;
  sysbvm_stackFrameBytecodeFunctionActivationRecord_t *activationRecord_local;
  sysbvm_context_t *context_local;
  
  context_local =
       (sysbvm_context_t *)
       sysbvm_bytecodeInterpreter_getSourcePositionForPC
                 (context,(sysbvm_functionBytecode_t *)activationRecord->functionBytecode,
                  activationRecord->pc);
  if (context_local == (sysbvm_context_t *)0x0) {
    if (*(long *)(activationRecord->functionDefinition + 0x70) == 0) {
      context_local = (sysbvm_context_t *)0x0;
    }
    else {
      context_local =
           *(sysbvm_context_t **)(*(long *)(activationRecord->functionDefinition + 0x70) + 0x10);
    }
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_bytecodeInterpreter_getSourcePositionForActivationRecord(sysbvm_context_t *context, sysbvm_stackFrameBytecodeFunctionActivationRecord_t *activationRecord)
{
    sysbvm_functionBytecode_t **functionBytecodeObject = (sysbvm_functionBytecode_t **)&activationRecord->functionBytecode;
    sysbvm_tuple_t actualSourcePosition = sysbvm_bytecodeInterpreter_getSourcePositionForPC(context, *functionBytecodeObject, activationRecord->pc);
    if(actualSourcePosition)
        return actualSourcePosition;

    sysbvm_functionDefinition_t **functionDefinitionObject = (sysbvm_functionDefinition_t**)&activationRecord->functionDefinition;
    if((*functionDefinitionObject)->sourceDefinition)
        return ((sysbvm_functionSourceDefinition_t*)(*functionDefinitionObject)->sourceDefinition)->sourcePosition;

    return SYSBVM_NULL_TUPLE;
}